

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

bool __thiscall ObjectFile::commitTransaction(ObjectFile *this)

{
  bool bVar1;
  MutexLocker lock;
  MutexLocker MStack_18;
  
  MutexLocker::MutexLocker(&MStack_18,this->objectMutex);
  if (this->inTransaction == true) {
    if (this->transactionLockFile == (File *)0x0) {
      bVar1 = false;
      softHSMLog(3,"commitTransaction",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x326,"Transaction lock file instance invalid!");
      goto LAB_00167bd6;
    }
    store(this,true);
    if (this->valid == true) {
      File::unlock(this->transactionLockFile);
      if (this->transactionLockFile != (File *)0x0) {
        (*this->transactionLockFile->_vptr_File[1])();
      }
      this->transactionLockFile = (File *)0x0;
      this->inTransaction = false;
      bVar1 = true;
      goto LAB_00167bd6;
    }
  }
  bVar1 = false;
LAB_00167bd6:
  MutexLocker::~MutexLocker(&MStack_18);
  return bVar1;
}

Assistant:

bool ObjectFile::commitTransaction()
{
	MutexLocker lock(objectMutex);

	if (!inTransaction)
	{
		return false;
	}

	if (transactionLockFile == NULL)
	{
		ERROR_MSG("Transaction lock file instance invalid!");

		return false;
	}

	// Special store case
	store(true);

	if (!valid)
	{
		return false;
	}

	transactionLockFile->unlock();

	delete transactionLockFile;
	transactionLockFile = NULL;
	inTransaction = false;

	return true;
}